

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemsave.c
# Opt level: O2

LispPTR vmem_save(char *sysout_file_name)

{
  DLword *page;
  LispPTR *pLVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  IFPAGE *pIVar5;
  __off_t _Var6;
  LispPTR *pLVar7;
  ssize_t sVar8;
  DLword DVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  LispPTR LVar14;
  uint uVar15;
  uint longwordcount;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  DLword *__buf;
  char tempname [4096];
  
  pLVar1 = FPtoVP;
  iVar3 = InterfacePage->nactivepages;
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 != 0) {
    return 0xe0006;
  }
  sprintf(tempname,"%s-temp",sysout_file_name);
  alarm(TIMEOUT_TIME);
  piVar4 = __errno_location();
  do {
    *piVar4 = 0;
    iVar2 = open(sysout_file_name,1,0x1b6);
    if (iVar2 != -1) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      goto LAB_001327ec;
    }
  } while (*piVar4 == 4);
  alarm(0);
  if (*piVar4 != 2) {
    return 0xe0003;
  }
  goto LAB_00132807;
  while (*piVar4 == 4) {
LAB_001327ec:
    *piVar4 = 0;
    iVar12 = close(iVar2);
    if (iVar12 != -1) break;
  }
  alarm(0);
LAB_00132807:
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar4 = 0;
    iVar2 = open(tempname,0x241,0x1b6);
    if (iVar2 != -1) break;
    if (*piVar4 != 4) {
      alarm(0);
      err_mess("open",*piVar4);
      return 0xe0003;
    }
  }
  alarm(0);
  pIVar5 = InterfacePage;
  InterfacePage->machinetype = 3;
  DVar9 = (DLword)*STORAGEFULLSTATE_word;
  if (DVar9 == 1) {
    *STORAGEFULLSTATE_word = 0;
    DVar9 = 0;
    pIVar5 = InterfacePage;
  }
  pIVar5->storagefullstate = DVar9;
  pLVar7 = pLVar1 + 2;
  uVar13 = (long)iVar3;
  for (iVar12 = 0; iVar12 < iVar3; iVar12 = iVar12 + 1) {
    lVar17 = (long)iVar12;
    uVar15 = pLVar1[lVar17 + 1];
    LVar14 = (LispPTR)uVar13;
    if (uVar15 < 0xffff0000) {
      alarm(TIMEOUT_TIME);
      while( true ) {
        *piVar4 = 0;
        _Var6 = lseek(iVar2,(long)(iVar12 << 9),0);
        if (_Var6 != -1) break;
        if (*piVar4 != 4) goto LAB_00132bab;
      }
      uVar18 = 0;
      alarm(0);
      uVar11 = pLVar1[lVar17 + 1];
      uVar10 = uVar11 << 8;
      longwordcount = 0;
      for (uVar16 = 0; (uVar11 == uVar15 && ((long)(lVar17 + uVar16) < (long)iVar3));
          uVar16 = uVar16 + 1) {
        uVar15 = uVar11 + 1;
        uVar11 = (pLVar1 + 2)[lVar17 + uVar16];
        uVar18 = uVar18 + 0x200;
        longwordcount = longwordcount + 0x80;
      }
      page = Lisp_world + uVar10;
      word_swap_page(page,longwordcount);
      uVar15 = TIMEOUT_TIME;
      if (maxpages < (uint)uVar16) {
        uVar13 = uVar16 & 0xffffffff;
        __buf = page;
        while (uVar15 = maxpages, uVar11 = (uint)uVar13, maxpages < uVar11) {
          alarm(TIMEOUT_TIME);
          while( true ) {
            *piVar4 = 0;
            pLVar7 = (LispPTR *)write(iVar2,__buf,(ulong)maxpages << 9);
            if (pLVar7 != (LispPTR *)0xffffffffffffffff) break;
            if (*piVar4 != 4) {
              alarm(0);
              err_mess("write",*piVar4);
              LVar14 = (uint)(*piVar4 != 0x7a) * 3 + 0xe0002;
              if (*piVar4 == 0x1c) {
                LVar14 = 0xe0002;
              }
              pLVar7 = (LispPTR *)0xffffffffffffffff;
              goto LAB_00132ace;
            }
          }
          alarm(0);
          __buf = __buf + (maxpages << 8);
          uVar13 = (ulong)(uVar11 - maxpages);
        }
        if (uVar11 != 0) {
          alarm(TIMEOUT_TIME);
          do {
            *piVar4 = 0;
            pLVar7 = (LispPTR *)write(iVar2,__buf,(ulong)(uVar11 << 9));
            if (pLVar7 != (LispPTR *)0xffffffffffffffff) break;
          } while (*piVar4 == 4);
          alarm(0);
LAB_00132ace:
          if (uVar15 < uVar11) {
            return LVar14;
          }
        }
      }
      else {
        TIMEOUT_TIME = ((uint)(uVar16 >> 3) & 0x1fffffff) + TIMEOUT_TIME;
        alarm(TIMEOUT_TIME);
        do {
          *piVar4 = 0;
          pLVar7 = (LispPTR *)write(iVar2,page,(ulong)uVar18);
          if (pLVar7 != (LispPTR *)0xffffffffffffffff) break;
        } while (*piVar4 == 4);
        alarm(0);
        TIMEOUT_TIME = uVar15;
      }
      uVar13 = (ulong)LVar14;
      word_swap_page(page,longwordcount);
      if (pLVar7 == (LispPTR *)0xffffffffffffffff) goto LAB_00132c36;
      iVar12 = iVar12 + -1 + (uint)uVar16;
    }
    else {
      uVar13 = uVar13 & 0xffffffff;
    }
  }
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar4 = 0;
    _Var6 = lseek(iVar2,0x200,0);
    if (_Var6 != -1) break;
    if (*piVar4 != 4) {
LAB_00132bab:
      alarm(0);
      err_mess("lseek",*piVar4);
      return 0xe0004;
    }
  }
  alarm(0);
  word_swap_page(InterfacePage,0x80);
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar4 = 0;
    sVar8 = write(iVar2,InterfacePage,0x200);
    if (sVar8 != -1) break;
    if (*piVar4 != 4) {
      alarm(0);
      word_swap_page(InterfacePage,0x80);
LAB_00132c36:
      err_mess("write",*piVar4);
      if (*piVar4 == 0x1c) {
        return 0xe0002;
      }
      return (uint)(*piVar4 != 0x7a) * 3 + 0xe0002;
    }
  }
  alarm(0);
  word_swap_page(InterfacePage,0x80);
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar4 = 0;
    iVar3 = close(iVar2);
    if (iVar3 != -1) break;
    if (*piVar4 != 4) {
      alarm(0);
      return 0xe0005;
    }
  }
  alarm(0);
  alarm(TIMEOUT_TIME);
  do {
    *piVar4 = 0;
    iVar3 = unlink(sysout_file_name);
    if (iVar3 != -1) {
      alarm(0);
      goto LAB_00132cfa;
    }
  } while (*piVar4 == 4);
  alarm(0);
  if (*piVar4 != 2) {
    return 0xe0003;
  }
LAB_00132cfa:
  alarm(TIMEOUT_TIME);
  do {
    *piVar4 = 0;
    iVar3 = rename(tempname,sysout_file_name);
    if (iVar3 != -1) {
      alarm(0);
      return 0;
    }
  } while (*piVar4 == 4);
  alarm(0);
  fprintf(_stderr,"sysout is saved to temp file, %s.",tempname);
  return 0xe0005;
}

Assistant:

LispPTR vmem_save(char *sysout_file_name)
{
  int sysout; /* SysoutFile descriptor */
#ifdef BIGVM
  unsigned int *fptovp;
#else
  DLword *fptovp; /* FPTOVP */
#endif          /* BIGVM */
  int vmemsize; /* VMEMSIZE */
  int i;
  char tempname[MAXPATHLEN];
  ssize_t rsize;
  off_t roff;
  int rval;
#ifndef DOS
  extern int ScreenLocked;
  extern DLword *EmCursorX68K;
  extern DLword *EmCursorY68K;
  extern DLword NullCursor[];
  extern DLword *EmCursorBitMap68K;
#endif /* DOS */

/* remove cursor image from screen */

#ifdef   DOS
  /*  For DOS, must also take the mouse cursor away (it's  */
  /*  written into the display-region bitmap).	     */
  currentdsp->device.locked++;
  (currentdsp->mouse_invisible)(currentdsp, IOPage);
#endif /* SUNDISPLAY || DOS */

  /* set FPTOVP */
  fptovp = FPtoVP + 1;

  /* set VMEMSIZE */
  vmemsize = InterfacePage->nactivepages;

  /*	[HH:6-Jan-89]
          Sequence of save image
          (1) Sysout image is saved to a temporary file, tempname.
          (2) if a specified file, sysout_file_name, is exist, the file is removed.
          (3) the temporary file is renamed to the specified file.
  */

  SETJMP(FILETIMEOUT);
#ifdef DOS
  /* Bloddy 8 char filenames in dos ... /jarl */
  make_old_version(tempname, sysout_file_name);
#else  /* DOS */
  sprintf(tempname, "%s-temp", sysout_file_name);
#endif /* DOS */

  /* Confirm protection of specified file by open/close */

  TIMEOUT(sysout = open(sysout_file_name, O_WRONLY, 0666));
  if (sysout == -1) {
    /* No file error skip return. */
    if (errno != ENOENT) return (FILECANNOTOPEN); /* No such file error.*/
  } else
    TIMEOUT(rval = close(sysout));

  /* open temp file */
  TIMEOUT(sysout = open(tempname, O_WRONLY | O_CREAT | O_TRUNC, 0666));
  if (sysout == -1) {
    err_mess("open", errno);
    return (FILECANNOTOPEN);
  }

  InterfacePage->machinetype = MACHINETYPE_MAIKO;

  /* Restore storagefull state */
  if (((*STORAGEFULLSTATE_word) & 0xffff) == SFS_NOTSWITCHABLE) {
    /* This sysout uses only 8 Mbyte lisp space.
       It may be able to use this SYSOUT which has more than
       8 Mbyte lisp space.
       To enable to expand lisp space, \\STORAGEFULLSTATE
       should be NIL.
    */
    *STORAGEFULLSTATE_word = NIL;
    InterfacePage->storagefullstate = NIL;
  } else {
    /*  Otherwise, just restore storagefullstate in IFPAGE */
    InterfacePage->storagefullstate = (*STORAGEFULLSTATE_word) & 0xffff;
  }

/* First, sort fptovp table, trying to get pages contiguous */
#ifndef BIGVM
#ifndef BYTESWAP
  /* Byte-swapped machines don't sort the table right. */
  sort_fptovp(fptovp, vmemsize);
#endif
#endif

  /* store vmem to sysoutfile */

  for (i = 0; i < vmemsize; i++) {
    if (GETPAGEOK(fptovp, i) != 0177777) {
      unsigned int oldfptovp = GETFPTOVP(fptovp, i);
      unsigned int saveoldfptovp = oldfptovp;
      unsigned int contig_pages = 0;
      DLword *base_addr;

      TIMEOUT(roff = lseek(sysout, i * BYTESPER_PAGE, SEEK_SET));
      if (roff == -1) {
        err_mess("lseek", errno);
        return (FILECANNOTSEEK);
      }
      base_addr = Lisp_world + (GETFPTOVP(fptovp, i) * DLWORDSPER_PAGE);

      /* Now, let's see how many pages we can dump */
      while (GETFPTOVP(fptovp, i) == oldfptovp && i < vmemsize) {
        contig_pages++; oldfptovp++; i++;
      }
      i--; /* Previous loop always overbumps i */
      DBPRINT(("%4d: writing %d pages from %tx (%d)\n", i, contig_pages, (char *)base_addr - (char *)Lisp_world, saveoldfptovp));

#ifdef BYTESWAP
      word_swap_page(base_addr, contig_pages * CELLSPER_PAGE);
#endif /* BYTESWAP */

      if (contig_pages > maxpages) {
        DLword *ba = base_addr;
        unsigned int pc = contig_pages;
        while (pc > maxpages) {
          TIMEOUT(rsize = write(sysout, ba, (size_t)maxpages * BYTESPER_PAGE));
          if (rsize == -1) {
            err_mess("write", errno);
            return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
          }
          ba += maxpages * DLWORDSPER_PAGE;
          pc -= maxpages;
        }
        if (pc > 0) TIMEOUT(rsize = write(sysout, ba, pc * BYTESPER_PAGE));
      } else {
        unsigned int oldTT = TIMEOUT_TIME;
        /* As we can spend longer than TIMEOUT_TIME doing a big
           write, we adjust the timeout temporarily here */
        TIMEOUT_TIME += contig_pages >> 3;
        TIMEOUT(rsize = write(sysout, base_addr, contig_pages * BYTESPER_PAGE));
        TIMEOUT_TIME = oldTT;
      }
#ifdef BYTESWAP
      word_swap_page(base_addr, contig_pages * CELLSPER_PAGE);
#endif /* BYTESWAP */

      if (rsize == -1) {
        err_mess("write", errno);
	return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
      }
    }
  }

  /* seek to IFPAGE */
  TIMEOUT(roff = lseek(sysout, (long)FP_IFPAGE, SEEK_SET));
  if (roff == -1) {
    err_mess("lseek", errno);
    return (FILECANNOTSEEK);
  }
#ifdef BYTESWAP
  word_swap_page(InterfacePage, CELLSPER_PAGE);
#endif /* BYTESWAP */

  TIMEOUT(rsize = write(sysout, (char *)InterfacePage, BYTESPER_PAGE));
#ifdef BYTESWAP
  word_swap_page(InterfacePage, CELLSPER_PAGE);
#endif /* BYTESWAP */

  if (rsize == -1) {
    err_mess("write", errno);
	return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
  }

#ifdef OS5
  /* Seems to write all pages at close, so timeout
     is WAY to short, no matter how big.  JDS 960925 */
  rval = close(sysout);
#else
  TIMEOUT(rval = close(sysout));
#endif /* OS5 */
  if (rval == -1) { return (FILECANNOTWRITE); }

  TIMEOUT(rval = unlink(sysout_file_name));
  if (rval == -1) {
    /* No file error skip return. */
    if (errno != ENOENT) /* No such file error.*/
      return (FILECANNOTOPEN);
  }

  TIMEOUT(rval = rename(tempname, sysout_file_name));
  if (rval == -1) {
    (void)fprintf(stderr, "sysout is saved to temp file, %s.", tempname);
    return (FILECANNOTWRITE);
  }

/* restore cursor image to screen */
#ifdef DOS
  /* Must also put the mouse back. */
  (currentdsp->mouse_visible)(IOPage->dlmousex, IOPage->dlmousey);
  currentdsp->device.locked--;

#endif /* SUNDISPLAY */

  /*printf("vmem is saved completely.\n");*/
  return (COMPLETESYSOUT);
}